

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O3

bool __thiscall QBoxLayout::setStretchFactor(QBoxLayout *this,QWidget *widget,int stretch)

{
  long lVar1;
  undefined8 *puVar2;
  QWidget *pQVar3;
  ulong uVar4;
  
  if (widget == (QWidget *)0x0) {
    return false;
  }
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  if (*(long *)(lVar1 + 0xc0) != 0) {
    uVar4 = 0;
    do {
      puVar2 = *(undefined8 **)(*(long *)(lVar1 + 0xb8) + uVar4 * 8);
      pQVar3 = (QWidget *)(**(code **)(*(long *)*puVar2 + 0x68))();
      if (pQVar3 == widget) {
        *(int *)(puVar2 + 1) = stretch;
        (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
        return true;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < *(ulong *)(lVar1 + 0xc0));
  }
  return false;
}

Assistant:

bool QBoxLayout::setStretchFactor(QWidget *widget, int stretch)
{
    Q_D(QBoxLayout);
    if (!widget)
        return false;
    for (int i = 0; i < d->list.size(); ++i) {
        QBoxLayoutItem *box = d->list.at(i);
        if (box->item->widget() == widget) {
            box->stretch = stretch;
            invalidate();
            return true;
        }
    }
    return false;
}